

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void TransformWHT_C(int16_t *in,int16_t *out)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int aiStack_78 [4];
  int aiStack_68 [8];
  int tmp [16];
  
  for (lVar2 = 0xc; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    iVar1 = (int)in[lVar2] + (int)in[lVar2 + -0xc];
    iVar4 = (int)in[lVar2 + -4] + (int)in[lVar2 + -8];
    iVar6 = (int)in[lVar2 + -8] - (int)in[lVar2 + -4];
    iVar3 = (int)in[lVar2 + -0xc] - (int)in[lVar2];
    aiStack_78[lVar2] = iVar4 + iVar1;
    tmp[lVar2 + -4] = iVar1 - iVar4;
    aiStack_68[lVar2] = iVar6 + iVar3;
    tmp[lVar2] = iVar3 - iVar6;
  }
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
    iVar4 = *(int *)((long)tmp + lVar2 + 4);
    iVar3 = *(int *)((long)tmp + lVar2 + 0xc);
    iVar5 = *(int *)((long)tmp + lVar2) + iVar3 + 3;
    iVar6 = *(int *)((long)tmp + lVar2 + 8);
    iVar1 = iVar6 + iVar4;
    iVar4 = iVar4 - iVar6;
    iVar3 = (*(int *)((long)tmp + lVar2) + 3) - iVar3;
    out[lVar2 * 4] = (int16_t)((uint)(iVar1 + iVar5) >> 3);
    out[lVar2 * 4 + 0x10] = (int16_t)((uint)(iVar4 + iVar3) >> 3);
    out[lVar2 * 4 + 0x20] = (int16_t)((uint)(iVar5 - iVar1) >> 3);
    out[lVar2 * 4 + 0x30] = (int16_t)((uint)(iVar3 - iVar4) >> 3);
  }
  return;
}

Assistant:

static void TransformWHT_C(const int16_t* in, int16_t* out) {
  int tmp[16];
  int i;
  for (i = 0; i < 4; ++i) {
    const int a0 = in[0 + i] + in[12 + i];
    const int a1 = in[4 + i] + in[ 8 + i];
    const int a2 = in[4 + i] - in[ 8 + i];
    const int a3 = in[0 + i] - in[12 + i];
    tmp[0  + i] = a0 + a1;
    tmp[8  + i] = a0 - a1;
    tmp[4  + i] = a3 + a2;
    tmp[12 + i] = a3 - a2;
  }
  for (i = 0; i < 4; ++i) {
    const int dc = tmp[0 + i * 4] + 3;    // w/ rounder
    const int a0 = dc             + tmp[3 + i * 4];
    const int a1 = tmp[1 + i * 4] + tmp[2 + i * 4];
    const int a2 = tmp[1 + i * 4] - tmp[2 + i * 4];
    const int a3 = dc             - tmp[3 + i * 4];
    out[ 0] = (a0 + a1) >> 3;
    out[16] = (a3 + a2) >> 3;
    out[32] = (a0 - a1) >> 3;
    out[48] = (a3 - a2) >> 3;
    out += 64;
  }
}